

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O2

int Nwk_ManVerifyTopoOrder(Nwk_Man_t *pNtk)

{
  uint uVar1;
  long *plVar2;
  uint uVar3;
  int i;
  int iVar4;
  long *plVar5;
  ulong uVar6;
  Nwk_Obj_t *pNVar7;
  ulong uVar8;
  int i_00;
  char *__format;
  bool bVar9;
  
  Nwk_ManIncrementTravId(pNtk);
  i_00 = 0;
  do {
    if (pNtk->vObjs->nSize <= i_00) {
      return 1;
    }
    plVar5 = (long *)Vec_PtrEntry(pNtk->vObjs,i_00);
    if (plVar5 != (long *)0x0) {
      uVar3 = *(uint *)(plVar5 + 4) & 7;
      if (uVar3 - 2 < 2) {
        uVar6 = (ulong)*(uint *)((long)plVar5 + 0x3c);
        if ((int)*(uint *)((long)plVar5 + 0x3c) < 1) {
          uVar6 = 0;
        }
        uVar8 = 0;
        while ((uVar6 != uVar8 &&
               (plVar2 = *(long **)(plVar5[9] + uVar8 * 8), plVar2 != (long *)0x0))) {
          uVar8 = uVar8 + 1;
          if ((int)plVar2[5] != *(int *)(*plVar2 + 0x68)) {
            uVar3 = *(uint *)((long)plVar5 + 0x24);
            uVar1 = *(uint *)((long)plVar2 + 0x24);
            __format = "Node %d has fanin %d that is not in a topological order.\n";
LAB_00707b0c:
            printf(__format,(ulong)uVar3,(ulong)uVar1);
            return 0;
          }
        }
      }
      else {
        if (uVar3 != 1) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkDfs.c"
                        ,0x55,"int Nwk_ManVerifyTopoOrder(Nwk_Man_t *)");
        }
        if ((pNtk->pManTime != (Tim_Man_t *)0x0) &&
           (uVar3 = Tim_ManBoxForCi(pNtk->pManTime,*(uint *)(plVar5 + 4) >> 7), -1 < (int)uVar3)) {
          i = Tim_ManBoxInputFirst(pNtk->pManTime,uVar3);
          iVar4 = Tim_ManBoxInputNum(pNtk->pManTime,uVar3);
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          while (bVar9 = iVar4 != 0, iVar4 = iVar4 + -1, bVar9) {
            pNVar7 = Nwk_ManCo(pNtk,i);
            i = i + 1;
            if (pNVar7->TravId != pNVar7->pMan->nTravIds) {
              uVar1 = pNVar7->Id;
              __format = "Box %d has input %d that is not in a topological order.\n";
              goto LAB_00707b0c;
            }
          }
        }
      }
      *(undefined4 *)(plVar5 + 5) = *(undefined4 *)(*plVar5 + 0x68);
    }
    i_00 = i_00 + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Verifies that the objects are in a topo order.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Nwk_ManVerifyTopoOrder( Nwk_Man_t * pNtk )
{
    Nwk_Obj_t * pObj, * pNext;
    int i, k, iBox, iTerm1, nTerms;
    Nwk_ManIncrementTravId( pNtk );
    Nwk_ManForEachObj( pNtk, pObj, i )
    {
        if ( Nwk_ObjIsNode(pObj) || Nwk_ObjIsCo(pObj) )
        {
            Nwk_ObjForEachFanin( pObj, pNext, k )
            {
                if ( !Nwk_ObjIsTravIdCurrent(pNext) )
                {
                    printf( "Node %d has fanin %d that is not in a topological order.\n", pObj->Id, pNext->Id );
                    return 0;
                }
            }
        }
        else if ( Nwk_ObjIsCi(pObj) )
        {
            if ( pNtk->pManTime )
            {
                iBox = Tim_ManBoxForCi( pNtk->pManTime, pObj->PioId );
                if ( iBox >= 0 ) // this is not a true PI
                {
                    iTerm1 = Tim_ManBoxInputFirst( pNtk->pManTime, iBox );
                    nTerms = Tim_ManBoxInputNum( pNtk->pManTime, iBox );
                    for ( k = 0; k < nTerms; k++ )
                    {
                        pNext = Nwk_ManCo( pNtk, iTerm1 + k );
                        if ( !Nwk_ObjIsTravIdCurrent(pNext) )
                        {
                            printf( "Box %d has input %d that is not in a topological order.\n", iBox, pNext->Id );
                            return 0;
                        }
                    }
                }
            }
        }
        else
            assert( 0 );
        Nwk_ObjSetTravIdCurrent( pObj );
    }
    return 1;
}